

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::dotR(Forth *this)

{
  uint __n;
  uint uVar1;
  Cell CVar2;
  _Setbase _Var3;
  _Setw _Var4;
  ostream *poVar5;
  SCell n;
  int width;
  Forth *this_local;
  
  requireDStackDepth(this,2,".R");
  __n = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  pop(this);
  if (this->writeToTarget == ToString) {
    CVar2 = getNumericBase(this);
    _Var3 = std::setbase(CVar2);
    poVar5 = std::operator<<((ostream *)&this->field_0x20,_Var3);
    _Var4 = std::setw(__n);
    poVar5 = std::operator<<(poVar5,_Var4);
    std::ostream::operator<<(poVar5,uVar1);
  }
  else if (this->writeToTarget == ToStdCout) {
    CVar2 = getNumericBase(this);
    _Var3 = std::setbase(CVar2);
    poVar5 = std::operator<<((ostream *)&std::cout,_Var3);
    _Var4 = std::setw(__n);
    poVar5 = std::operator<<(poVar5,_Var4);
    std::ostream::operator<<(poVar5,uVar1);
    std::ostream::flush();
  }
  return;
}

Assistant:

void dotR() {
			REQUIRE_DSTACK_DEPTH(2, ".R");
			auto width = static_cast<int>(dStack.getTop()); pop();
			auto n = static_cast<SCell>(dStack.getTop()); pop();
#ifndef FORTHSCRIPTCPP_DISABLE_OUTPUT
			switch (writeToTarget) {
			case ToString:
				std_cout << SETBASE() << std::setw(width) << n;
				break;
			case ToStdCout:
				std::cout << SETBASE() << std::setw(width) << n;
				std::cout.flush();
				break;
			default:
				break;
			}
#endif
		}